

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

int jpc_com_getparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *in)

{
  int iVar1;
  uchar *puVar2;
  jpc_com_t *com;
  jas_stream_t *in_local;
  jpc_cstate_t *cstate_local;
  jpc_ms_t *ms_local;
  
  iVar1 = jpc_getuint16(in,(uint_fast16_t *)&(ms->parms).soc);
  if (iVar1 != 0) {
    return -1;
  }
  (ms->parms).poc.pchgs = (jpc_pocpchg_t *)(ms->len - 2);
  if ((ms->parms).sot.len == 0) {
    (ms->parms).siz.height = 0;
  }
  else {
    puVar2 = (uchar *)jas_malloc((ms->parms).sot.len);
    (ms->parms).ppm.data = puVar2;
    if (puVar2 == (uchar *)0x0) {
      return -1;
    }
    iVar1 = jas_stream_read(in,(ms->parms).ppm.data,(uint)(ms->parms).sot.len);
    if (iVar1 != (int)(ms->parms).sot.len) {
      return -1;
    }
  }
  return 0;
}

Assistant:

static int jpc_com_getparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *in)
{
	jpc_com_t *com = &ms->parms.com;

	/* Eliminate compiler warning about unused variables. */
	(void)cstate;

	if (jpc_getuint16(in, &com->regid)) {
		return -1;
	}
	com->len = ms->len - 2;
	if (com->len > 0) {
		if (!(com->data = jas_malloc(com->len))) {
			return -1;
		}
		if (jas_stream_read(in, com->data, com->len) != JAS_CAST(int, com->len)) {
			return -1;
		}
	} else {
		com->data = 0;
	}
	return 0;
}